

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.h
# Opt level: O2

bool __thiscall CmdLineArgsParser::IsHexDigit(CmdLineArgsParser *this)

{
  WCHAR WVar1;
  
  WVar1 = *this->pszCurrentArg;
  if (0x2f < (ushort)WVar1) {
    if ((ushort)WVar1 < 0x3a) {
      return true;
    }
    if (0x40 < (ushort)WVar1) {
      if ((ushort)WVar1 < 0x47) {
        return true;
      }
      return (ushort)(WVar1 + L'ﾟ') < 6;
    }
  }
  return false;
}

Assistant:

bool IsHexDigit()
            {
                return (CurChar() >= '0' && CurChar() <= '9') ||
                    (CurChar() >= 'A' && CurChar() <= 'F') ||
                    (CurChar() >= 'a' && CurChar() <= 'f');
            }